

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * tinyusdz::print_typed_attr<float>
                   (string *__return_storage_ptr__,
                   TypedAttribute<tinyusdz::Animatable<float>_> *attr,string *name,uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pPVar2;
  Path *v;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  ostream *poVar8;
  undefined4 in_register_0000000c;
  pointer pPVar9;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  undefined8 extraout_RDX;
  long lVar10;
  char *pcVar11;
  uint32_t uVar12;
  bool bVar13;
  bool bVar14;
  stringstream ss;
  string local_250;
  undefined8 local_230;
  undefined4 local_224;
  string *local_220;
  byte local_218;
  float local_210;
  undefined2 local_20c;
  TypedTimeSamples<float> local_208;
  ulong local_1e8;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e8 = CONCAT44(in_register_0000000c,indent);
  local_220 = name;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar7 = (attr->_attrib).has_value_;
  if ((((bVar7 == false) &&
       ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start)) && (attr->_value_empty == false)) &&
     (attr->_blocked != true)) goto LAB_00315fc6;
  pPVar2 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar9 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((pPVar9 == pPVar2 && bVar7 == false) && (attr->_blocked == false)) {
    local_230 = (double)CONCAT44(local_230._4_4_,
                                 (int)CONCAT71((int7)((ulong)extraout_RDX >> 8),attr->_value_empty))
    ;
  }
  else {
    local_230 = (double)((ulong)local_230._4_4_ << 0x20);
  }
  bVar13 = pPVar9 != pPVar2;
  local_218 = bVar7;
  local_1e0 = __return_storage_ptr__;
  if ((bVar7 ^ 1U) == 0) {
    local_20c = *(undefined2 *)((long)&(attr->_attrib).contained + 4);
    local_210 = *(float *)&(attr->_attrib).contained;
    ::std::
    vector<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
    ::vector(&local_208._samples,
             (vector<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
              *)((long)&(attr->_attrib).contained + 8));
    local_208._dirty = *(bool *)((long)&(attr->_attrib).contained + 0x20);
  }
  bVar3 = local_218;
  uVar12 = (uint32_t)pPVar9;
  bVar4 = (byte)local_20c;
  if (local_218 == 1) {
    if (local_208._dirty == true) {
      TypedTimeSamples<float>::update(&local_208);
    }
    local_224 = (undefined4)
                CONCAT71((int7)((ulong)local_208._samples.
                                       super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                                       ._M_impl.super__Vector_impl_data._M_finish >> 8),
                         local_208._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_finish !=
                         local_208._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    local_224 = 0;
  }
  if (((local_218 == 1) && (local_20c._1_1_ == '\0')) && ((byte)local_20c == '\0')) {
    bVar14 = local_208._samples.
             super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_208._samples.
             super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar14 = false;
  }
  bVar6 = AttrMetas::authored(&attr->_metas);
  uVar5 = local_1e8;
  if (((bVar6) || ((byte)(bVar13 & (bVar7 ^ 1U) | bVar14) != 1)) ||
     (n_01 = n, (SUB81(local_230,0) != '\0' || attr->_blocked != false) || (bVar3 & bVar4) != 0)) {
    pprint::Indent_abi_cxx11_(&local_250,(pprint *)(local_1e8 & 0xffffffff),n);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_250._M_dataplus._M_p,local_250._M_string_length);
    paVar1 = &local_250.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT26(local_250.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_250.field_2._M_allocated_capacity._4_2_,
                                        local_250.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    local_250.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
    local_250.field_2._M_allocated_capacity._4_2_ = 0x74;
    local_250._M_string_length = 5;
    local_250._M_dataplus._M_p = (pointer)paVar1;
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,5);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,(local_220->_M_dataplus)._M_p,local_220->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT26(local_250.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_250.field_2._M_allocated_capacity._4_2_,
                                        local_250.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    if (attr->_blocked == true) {
      pcVar11 = " = None";
      lVar10 = 7;
LAB_00315bcd:
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar11,lVar10);
    }
    else if ((bVar3 & bVar4) != 0) {
      if (local_218 == 0) goto LAB_00316030;
      if ((local_20c._1_1_ == '\0') && ((byte)local_20c == '\x01')) {
        bVar7 = true;
        local_230 = (double)local_210;
      }
      else {
        bVar7 = false;
      }
      if (!bVar7) {
        pcVar11 = " = [InternalError]";
        lVar10 = 0x12;
        goto LAB_00315bcd;
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
      ::std::ostream::_M_insert<double>(local_230);
    }
    bVar7 = AttrMetas::authored(&attr->_metas);
    if (bVar7) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
      print_attr_metas_abi_cxx11_
                (&local_250,(tinyusdz *)attr,(AttrMeta *)(ulong)((int)uVar5 + 1),uVar12);
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_250._M_dataplus._M_p,local_250._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(uVar5 & 0xffffffff),n_00);
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar1) {
        operator_delete(local_250._M_dataplus._M_p,
                        CONCAT26(local_250.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_250.field_2._M_allocated_capacity._4_2_,
                                          local_250.field_2._M_allocated_capacity._0_4_)) + 1);
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX;
  }
  uVar5 = local_1e8;
  if ((char)local_224 != '\0') {
    uVar12 = (uint32_t)local_1e8;
    pprint::Indent_abi_cxx11_(&local_250,(pprint *)(local_1e8 & 0xffffffff),n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_250._M_dataplus._M_p,local_250._M_string_length);
    paVar1 = &local_250.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT26(local_250.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_250.field_2._M_allocated_capacity._4_2_,
                                        local_250.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    local_250.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
    local_250.field_2._M_allocated_capacity._4_2_ = 0x74;
    local_250._M_string_length = 5;
    local_250._M_dataplus._M_p = (pointer)paVar1;
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,5);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,(local_220->_M_dataplus)._M_p,local_220->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT26(local_250.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_250.field_2._M_allocated_capacity._4_2_,
                                        local_250.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
    if (local_218 == 0) {
LAB_00316030:
      __assert_fail("has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                    ,0x584,
                    "const value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::value() const [T = tinyusdz::Animatable<float>]"
                   );
    }
    print_typed_timesamples<float>(&local_250,&local_208,uVar12);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_250._M_dataplus._M_p,local_250._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT26(local_250.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_250.field_2._M_allocated_capacity._4_2_,
                                        local_250.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX_00;
  }
  if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_(&local_250,(pprint *)(uVar5 & 0xffffffff),n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_250._M_dataplus._M_p,local_250._M_string_length);
    paVar1 = &local_250.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT26(local_250.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_250.field_2._M_allocated_capacity._4_2_,
                                        local_250.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    local_250.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
    local_250.field_2._M_allocated_capacity._4_2_ = 0x74;
    local_250._M_string_length = 5;
    local_250._M_dataplus._M_p = (pointer)paVar1;
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,5);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,(local_220->_M_dataplus)._M_p,local_220->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT26(local_250.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_250.field_2._M_allocated_capacity._4_2_,
                                        local_250.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start;
    lVar10 = ((long)(attr->_paths).
                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)v >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar10 == 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar10 == 1) {
      ::std::operator<<(local_1a8,v);
    }
    else {
      ::std::operator<<(local_1a8,&attr->_paths);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
  __return_storage_ptr__ = local_1e0;
  if ((local_218 == 1) &&
     (local_208._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_208._samples.
                    super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_208._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    __return_storage_ptr__ = local_1e0;
  }
LAB_00315fc6:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}